

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,LoopStatement *loop)

{
  bool bVar1;
  Expression *pEVar2;
  Constant *pCVar3;
  int64_t iVar4;
  Expression *source;
  Type local_80;
  CompileMessage local_68;
  pool_ptr<soul::AST::Constant> local_20;
  pool_ptr<soul::AST::Constant> c;
  LoopStatement *loop_local;
  PostResolutionChecks *this_local;
  
  c.object = (Constant *)loop;
  ASTVisitor::visit(&this->super_ASTVisitor,loop);
  bVar1 = pool_ptr<soul::AST::Expression>::operator!=
                    ((pool_ptr<soul::AST::Expression> *)&((c.object)->value).type.structure,
                     (void *)0x0);
  if (bVar1) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                       ((pool_ptr<soul::AST::Expression> *)&((c.object)->value).type.structure);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_20);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_20);
    if (bVar1) {
      pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_20);
      iVar4 = soul::Value::getAsInt64(&pCVar3->value);
      if (iVar4 < 1) {
        pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                           ((pool_ptr<soul::AST::Expression> *)&((c.object)->value).type.structure);
        Errors::negativeLoopCount<>();
        AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_68,false)
        ;
      }
    }
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_20);
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                       ((pool_ptr<soul::AST::Expression> *)&((c.object)->value).type.structure);
    Type::Type(&local_80,int64);
    source = pool_ptr<soul::AST::Expression>::operator*
                       ((pool_ptr<soul::AST::Expression> *)&((c.object)->value).type.structure);
    expectSilentCastPossible(&(pEVar2->super_Statement).super_ASTObject.context,&local_80,source);
    Type::~Type(&local_80);
  }
  return;
}

Assistant:

void visit (AST::LoopStatement& loop) override
        {
            super::visit (loop);

            if (loop.numIterations != nullptr)
            {
                if (auto c = loop.numIterations->getAsConstant())
                    if (c->value.getAsInt64() <= 0)
                        loop.numIterations->context.throwError (Errors::negativeLoopCount());

                expectSilentCastPossible (loop.numIterations->context,
                                          Type (PrimitiveType::int64), *loop.numIterations);
            }
        }